

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QDateTime>::relocate
          (QArrayDataPointer<QDateTime> *this,qsizetype offset,QDateTime **data)

{
  bool bVar1;
  QDateTime *first;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QDateTime> *in_RDI;
  QDateTime **unaff_retaddr;
  QDateTime *res;
  QArrayDataPointer<QDateTime> *c;
  
  first = in_RDI->ptr + in_RSI * 8;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QDateTime,long_long>(first,(longlong)in_RDI,(QDateTime *)0x1d5b97)
  ;
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QDateTime>,QDateTime_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }